

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_clp__parse(fct_clp_t *clp,int argc,char **argv)

{
  size_t sVar1;
  fctcl_t *clo;
  bool bVar2;
  int iVar3;
  char *__s;
  char *option;
  char *pcVar4;
  int iVar5;
  char *buffer_len;
  ulong uVar6;
  
  clp->error_msg[0] = '\0';
  clp->is_error = 0;
  if (argc < 2) {
    return;
  }
  iVar5 = 1;
  do {
    __s = fctstr_clone(argv[iVar5]);
    option = strtok(__s,"=");
    pcVar4 = strtok((char *)0x0,"=");
    sVar1 = (clp->clo_list).used_itm_num;
    bVar2 = true;
    if (sVar1 != 0) {
      uVar6 = 0;
      do {
        if ((clp->clo_list).used_itm_num <= uVar6) {
          __assert_fail("idx < list->used_itm_num",
                        "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                        ,0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
        }
        clo = (fctcl_t *)(clp->clo_list).itm_list[uVar6];
        buffer_len = option;
        iVar3 = fctcl__is_option(clo,option);
        if (iVar3 != 0) {
          if (clo->action == FCTCL_STORE_TRUE) {
            pcVar4 = "1";
LAB_00105048:
            pcVar4 = fctstr_clone(pcVar4);
            clo->value = pcVar4;
          }
          else if (clo->action == FCTCL_STORE_VALUE) {
            if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
              iVar5 = iVar5 + 1;
              if (argc <= iVar5) {
                fct_snprintf(clp->error_msg,(size_t)buffer_len,"missing argument for %s",option);
                clp->is_error = 1;
                return;
              }
              pcVar4 = argv[iVar5];
            }
            goto LAB_00105048;
          }
          bVar2 = false;
          goto LAB_00105058;
        }
        uVar6 = uVar6 + 1;
      } while (sVar1 != uVar6);
      bVar2 = true;
    }
LAB_00105058:
    if (clp->is_error != 0) {
      return;
    }
    if (bVar2) {
      fct_nlist__append(&clp->param_list,__s);
    }
    else if (__s != (char *)0x0) {
      free(__s);
    }
    iVar5 = iVar5 + 1;
    if (argc <= iVar5) {
      return;
    }
  } while( true );
}

Assistant:

static void
fct_clp__parse(fct_clp_t *clp, int argc, char const *argv[])
{
    int argi =1;
    int is_option =0;
    char *arg =NULL;
    char *token =NULL;
    char *next_token =NULL;

    clp->error_msg[0] = '\0';
    clp->is_error =0;

    while ( argi < argc )
    {
        is_option =0;
        token =NULL;
        next_token = NULL;
        arg = fctstr_clone(argv[argi]);

#if defined(_MSC_VER) && _MSC_VER > 1300
        token = strtok_s(arg, "=", &next_token);
#else
        token = strtok(arg, "=");
        next_token = strtok(NULL, "=");
#endif

        FCT_NLIST_FOREACH_BGN(fctcl_t*, pclo, &(clp->clo_list))
        {
            /* Need to reset for each search. strtok below is destructive. */
            if ( fctcl__is_option(pclo, token) )
            {
                is_option =1;
                if ( pclo->action == FCTCL_STORE_VALUE )
                {
                    /* If this is --xxxx=value then the next strtok should succeed.
                    Otherwise, we need to chew up the next argument. */
                    if ( next_token != NULL && strlen(next_token) > 0 )
                    {
                        fctcl__set_value(pclo, next_token);
                    }
                    else
                    {
                        ++argi; /* Chew up the next value */
                        if ( argi >= argc )
                        {
                            /* error */
                            fct_snprintf(
                                clp->error_msg,
                                FCT_CLP_MAX_ERR_MSG_LEN,
                                "missing argument for %s",
                                token
                            );
                            clp->is_error =1;
                            break;
                        }
                        fctcl__set_value(pclo, argv[argi]);
                    }
                }
                else if (pclo->action == FCTCL_STORE_TRUE)
                {
                    fctcl__set_value(pclo, FCTCL_TRUE_STR);
                }
                else
                {
                    FCT_ASSERT("undefined action requested");
                }
                break;  /* No need to parse this argument further. */
            }
        }
        FCT_NLIST_FOREACH_END();
        /* If we have an error, exit. */
        if ( clp->is_error )
        {
            break;
        }
        /* If we walked through all the options, and didn't find
        anything, then we must have a parameter. Forget the fact that
        an unknown option will be treated like a parameter... */
        if ( !is_option )
        {
            fct_nlist__append(&(clp->param_list), arg);
            arg =NULL;  /* Owned by the nlist */
        }
        ++argi;
        if ( arg != NULL )
        {
            free(arg);
            arg =NULL;
        }
    }
}